

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,real threshold,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  pointer *pppVar1;
  int32_t node_00;
  int iVar2;
  pointer ppVar3;
  iterator __position;
  pointer pNVar4;
  pointer ppVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  float fVar13;
  double dVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  float local_54;
  pair<float,_int> local_40;
  double local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_38 = (double)threshold + 1e-05;
  local_54 = score;
  while( true ) {
    dVar14 = ::log(local_38);
    if (local_54 < (float)dVar14) {
      return;
    }
    ppVar3 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (((long)__position._M_current - (long)ppVar3 >> 3 == (long)k) && (local_54 < ppVar3->first))
    {
      return;
    }
    lVar8 = (long)node;
    pNVar4 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pNVar4[lVar8].left == -1) && (pNVar4[lVar8].right == -1)) break;
    if ((this->quant_ == true) &&
       (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true)) {
      auVar15._0_4_ =
           QMatrix::dotRow((this->qwo_).
                           super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           hidden,lVar8 - this->osz_);
      auVar15._4_60_ = extraout_var;
      auVar12 = auVar15._0_16_;
    }
    else {
      auVar16._0_4_ =
           Matrix::dotRow((this->wo_).
                          super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          hidden,lVar8 - this->osz_);
      auVar16._4_60_ = extraout_var_00;
      auVar12 = auVar16._0_16_;
    }
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar12,auVar7);
    fVar13 = expf(auVar12._0_4_);
    fVar13 = 1.0 / (fVar13 + 1.0);
    node_00 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8].left;
    dVar14 = ::log((double)(1.0 - fVar13) + 1e-05);
    dfs(this,k,threshold,node_00,(float)dVar14 + local_54,heap,hidden);
    node = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar8].right;
    dVar14 = ::log((double)fVar13 + 1e-05);
    local_54 = (float)dVar14 + local_54;
  }
  local_40.first = local_54;
  if (__position._M_current ==
      (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40.second = node;
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
    _M_realloc_insert<std::pair<float,int>>
              ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,__position,
               &local_40);
  }
  else {
    (__position._M_current)->first = local_54;
    (__position._M_current)->second = node;
    pppVar1 = &(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  ppVar3 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar13 = ppVar5[-1].first;
  iVar2 = ppVar5[-1].second;
  uVar9 = (long)ppVar5 - (long)ppVar3 >> 3;
  lVar8 = uVar9 - 1;
  if (1 < (long)uVar9) {
    do {
      lVar10 = (lVar8 + -1) - (lVar8 + -1 >> 0x3f) >> 1;
      if (ppVar3[lVar10].first <= fVar13) break;
      ppVar3[lVar8].first = ppVar3[lVar10].first;
      ppVar3[lVar8].second = ppVar3[lVar10].second;
      bVar6 = 2 < lVar8;
      lVar8 = lVar10;
    } while (bVar6);
  }
  ppVar3[lVar8].first = fVar13;
  ppVar3[lVar8].second = iVar2;
  if ((ulong)(long)k < uVar9) {
    if (8 < (long)ppVar5 - (long)ppVar3) {
      fVar13 = ppVar5[-1].first;
      iVar2 = ppVar5[-1].second;
      ppVar5[-1].first = ppVar3->first;
      ppVar5[-1].second = ppVar3->second;
      uVar9 = (long)(ppVar5 + -1) - (long)ppVar3;
      lVar8 = (long)uVar9 >> 3;
      if (lVar8 < 3) {
        lVar10 = 0;
      }
      else {
        lVar11 = 0;
        do {
          if (ppVar3[lVar11 * 2 + 1].first < ppVar3[lVar11 * 2 + 2].first) {
            lVar10 = lVar11 * 2 + 1;
          }
          else {
            lVar10 = lVar11 * 2 + 2;
          }
          ppVar3[lVar11].first = ppVar3[lVar10].first;
          ppVar3[lVar11].second = ppVar3[lVar10].second;
          lVar11 = lVar10;
        } while (lVar10 < (lVar8 + -1) - (lVar8 + -1 >> 0x3f) >> 1);
      }
      if (((uVar9 & 8) == 0) && (lVar10 == lVar8 + -2 >> 1)) {
        ppVar3[lVar10].first = ppVar3[lVar10 * 2 + 1].first;
        ppVar3[lVar10].second = ppVar3[lVar10 * 2 + 1].second;
        lVar10 = lVar10 * 2 + 1;
      }
      if (0 < lVar10) {
        do {
          lVar8 = (lVar10 + -1) - (lVar10 + -1 >> 0x3f) >> 1;
          if (ppVar3[lVar8].first <= fVar13) break;
          ppVar3[lVar10].first = ppVar3[lVar8].first;
          ppVar3[lVar10].second = ppVar3[lVar8].second;
          bVar6 = 2 < lVar10;
          lVar10 = lVar8;
        } while (bVar6);
      }
      ppVar3[lVar10].first = fVar13;
      ppVar3[lVar10].second = iVar2;
    }
    (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
  }
  return;
}

Assistant:

void Model::dfs(
		int32_t k,
		real threshold,
		int32_t node,
		real score,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden) const {
	if (score < std_log(threshold)) {
		return;
	}
	if (heap.size() == k && score < heap.front().first) {
		return;
	}

	if (tree[node].left == -1 && tree[node].right == -1) {
		heap.push_back(std::make_pair(score, node));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
		return;
	}

	real f;
	if (quant_ && args_->qout) {
		f = qwo_->dotRow(hidden, node - osz_);
	} else {
		f = wo_->dotRow(hidden, node - osz_);
	}
	f = 1. / (1 + std::exp(-f));

	dfs(k, threshold, tree[node].left, score + std_log(1.0 - f), heap, hidden);
	dfs(k, threshold, tree[node].right, score + std_log(f), heap, hidden);
}